

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall cs_impl::any::make_protect<cs::callable,cs::function&>(any *this,function *args)

{
  holder<cs::callable> *this_00;
  proxy *ppVar1;
  
  if ((DAT_00259ed8 == 0) || (cs::global_thread_counter != 0)) {
    this_00 = (holder<cs::callable> *)operator_new(0x30);
  }
  else {
    this_00 = *(holder<cs::callable> **)(&holder<bool>::allocator + DAT_00259ed8 * 8);
    DAT_00259ed8 = DAT_00259ed8 + -1;
  }
  holder<cs::callable>::holder<cs::function&>(this_00,args);
  if ((DAT_0025be20 == 0) || (cs::global_thread_counter != 0)) {
    ppVar1 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar1 = (proxy *)(&cs::null_pointer)[DAT_0025be20];
    DAT_0025be20 = DAT_0025be20 + -1;
  }
  ppVar1->is_rvalue = false;
  ppVar1->protect_level = 1;
  ppVar1->refcount = 1;
  ppVar1->data = &this_00->super_baseHolder;
  this->mDat = ppVar1;
  return (any)(proxy *)this;
}

Assistant:

static any make_protect(ArgsT &&...args)
		{
			return any(allocator.alloc(1, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}